

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

sparse_array_n<bool,_2,_std::allocator<bool>_> *
advance_board(sparse_array_n<bool,_2,_std::allocator<bool>_> *__return_storage_ptr__,
             sparse_array_n<bool,_2,_std::allocator<bool>_> *board,int *m,int *n)

{
  uint uVar1;
  bool *pbVar2;
  uint d0;
  uint uVar3;
  ulong uVar4;
  bool local_41;
  sparse_array_n<bool,_2,_std::allocator<bool>_> *local_40;
  int local_38;
  uint local_34;
  
  local_41 = false;
  local_40 = __return_storage_ptr__;
  sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::sparse_array_n
            (__return_storage_ptr__,&local_41,*m,(ulong)(uint)*n);
  if (*m != 0) {
    d0 = 0;
    do {
      if (*n != 0) {
        uVar4 = 0;
        do {
          local_38 = (int)uVar4;
          local_34 = d0;
          uVar1 = count_neighbours(board,m,n,(int *)&local_34,&local_38);
          pbVar2 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()(board,d0,uVar4);
          if (*pbVar2 == true) {
            if ((uVar1 & 0xfffffffe) == 2) {
LAB_00102600:
              pbVar2 = sisl::sparse_array_n<bool,_2,_std::allocator<bool>_>::operator()
                                 (local_40,d0,uVar4);
              *pbVar2 = true;
            }
          }
          else if (uVar1 == 3) goto LAB_00102600;
          uVar3 = (int)uVar4 + 1;
          uVar4 = (ulong)uVar3;
        } while (uVar3 < (uint)*n);
      }
      d0 = d0 + 1;
    } while (d0 < (uint)*m);
  }
  return local_40;
}

Assistant:

sisl::sparse_array_n<bool, 2> advance_board(const sisl::sparse_array_n<bool, 2> &board, const int &m, const int &n) {
	sisl::sparse_array_n<bool, 2> new_board(false, m,n);

	for(uint i = 0; i < m; i++)
		for(uint j = 0; j < n; j++) {
			int nbrs = count_neighbours(board, m, n, i, j);

			if(board(i,j)) {
			 	if(nbrs == 2 || nbrs == 3)
					new_board(i,j) = true;

			} else if(nbrs == 3) {
				new_board(i,j) = true;
			}
		}
	return new_board;
}